

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

int LZ4HC_compress_optimal
              (LZ4HC_CCtx_internal *ctx,char *source,char *dst,int *srcSizePtr,int dstCapacity,
              int nbSearches,size_t sufficient_len,limitedOutput_directive limit,int fullUpdate,
              dictCtx_directive dict,HCfavor_e favorDecSpeed)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *iLow;
  ulong *ip;
  ulong *puVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  LZ4HC_CCtx_internal *pLVar7;
  LZ4_byte *pLVar8;
  LZ4_byte *pLVar9;
  byte bVar10;
  U32 UVar11;
  uint uVar12;
  BYTE *d;
  void *__ptr;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  BYTE *pBVar16;
  BYTE BVar17;
  uint uVar18;
  long lVar19;
  ulong *puVar20;
  long lVar21;
  ulong *puVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  BYTE *pBVar30;
  uint uVar31;
  uint uVar32;
  ulong *puVar33;
  long lVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  ulong *puVar39;
  ulong *puVar40;
  ulong *puVar41;
  uint *puVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  ulong *puVar48;
  ulong *puVar49;
  ulong uVar50;
  int *piVar51;
  int iVar52;
  int *piVar53;
  int iVar54;
  ulong uVar55;
  BYTE *pBVar56;
  ulong uVar57;
  LZ4_byte *pLVar58;
  U32 target;
  ulong uVar59;
  U32 *hashTable;
  ulong *puVar60;
  bool bVar61;
  ulong local_1e8;
  LZ4_byte *local_1c8;
  LZ4_byte *local_1c0;
  BYTE *token;
  ulong local_1a8;
  BYTE *base;
  ulong local_198;
  LZ4_byte *local_190;
  ulong *local_188;
  ulong *local_178;
  int local_150;
  long local_138;
  ulong local_118;
  ulong local_110;
  int *local_b8;
  ulong *local_a8;
  int *local_a0;
  int local_50;
  int local_48;
  
  __ptr = malloc(0x10030);
  if (__ptr != (void *)0x0) {
    lVar19 = (long)*srcSizePtr;
    puVar39 = (ulong *)(source + lVar19 + -0xc);
    puVar20 = (ulong *)(source + lVar19 + -5);
    *srcSizePtr = 0;
    pBVar30 = (BYTE *)(dst + (ulong)(limit != fillOutput) * 5 + -5 + (long)dstCapacity);
    uVar23 = 0xfff;
    if (sufficient_len < 0xfff) {
      uVar23 = sufficient_len;
    }
    puVar1 = (ulong *)(source + lVar19 + -8);
    puVar2 = (ulong *)(source + lVar19 + -6);
    local_178 = (ulong *)source;
    local_188 = (ulong *)source;
    token = (BYTE *)dst;
LAB_001182c3:
    iVar26 = (int)local_188;
    iVar24 = -4 - iVar26;
    iVar25 = -5 - iVar26;
    iVar26 = iVar26 - (int)local_178;
    uVar12 = iVar26 - 0xf;
    puVar33 = local_188;
    local_a8 = local_188;
    iVar28 = iVar26;
LAB_0011830d:
    iVar28 = iVar28 + 1;
    local_a8 = (ulong *)((long)local_a8 + 1);
    if (local_188 <= puVar39) {
      pLVar7 = ctx->dictCtx;
      pLVar8 = ctx->base;
      pLVar9 = ctx->dictBase;
      uVar5 = ctx->dictLimit;
      uVar50 = (ulong)uVar5;
      uVar29 = (long)local_188 - (long)pLVar8;
      uVar6 = ctx->lowLimit;
      uVar18 = uVar6 + 0x10000;
      uVar47 = (uint)uVar29;
      uVar38 = (uint)*local_188;
      for (uVar13 = (ulong)ctx->nextToUpdate; uVar13 < (uVar29 & 0xffffffff); uVar13 = uVar13 + 1) {
        uVar27 = (uint)(*(int *)(pLVar8 + uVar13) * -0x61c8864f) >> 0x11;
        uVar31 = (uint)uVar13;
        uVar32 = uVar31 - ctx->hashTable[uVar27];
        if (0xfffe < uVar32) {
          uVar32 = 0xffff;
        }
        ctx->chainTable[uVar31 & 0xffff] = (LZ4_u16)uVar32;
        ctx->hashTable[uVar27] = uVar31;
      }
      uVar31 = uVar47 - 0xffff;
      if (uVar47 < uVar18) {
        uVar31 = uVar6;
      }
      ctx->nextToUpdate = uVar47;
      puVar60 = (ulong *)(pLVar8 + uVar50);
      uVar27 = (uint)*local_188 * -0x61c8864f >> 0x11;
      uVar13 = (ulong)ctx->hashTable[uVar27];
      puVar15 = (ulong *)((long)local_188 + 4);
      puVar22 = (ulong *)((long)local_188 + 0xc);
      puVar3 = (ulong *)(pLVar8 + uVar50 + 8);
      iLow = (ulong *)(pLVar9 + uVar6);
      ip = (ulong *)(pLVar9 + uVar50);
      local_1c0 = (LZ4_byte *)0x0;
      local_198 = 0;
      iVar54 = 0;
      iVar46 = 0;
      uVar59 = 3;
      iVar36 = nbSearches;
LAB_001184ab:
      uVar14 = uVar59;
      uVar32 = (uint)uVar13;
      iVar45 = (int)uVar14;
      local_138._0_4_ = (int)puVar15;
      if ((uVar32 < uVar31) || (iVar36 < 1)) goto LAB_00118b99;
      uVar59 = 0;
      if ((favorDecSpeed == favorCompressionRatio) || (7 < uVar47 - uVar32)) {
        uVar35 = uVar5 - uVar32;
        if (uVar5 < uVar32 || uVar35 == 0) {
          puVar42 = (uint *)(pLVar8 + uVar13);
          if ((*(short *)((long)local_188 + (long)iVar45 + -1) ==
               *(short *)((long)iVar45 + -1 + (long)puVar42)) && (*puVar42 == uVar38)) {
            puVar49 = (ulong *)(puVar42 + 1);
            puVar48 = puVar15;
            if (puVar39 <= puVar15) {
LAB_001185d5:
              iVar52 = iVar24 + (int)puVar48;
LAB_001185df:
              if (puVar48 < puVar39) {
                if (*puVar49 == *puVar48) goto code_r0x001185f9;
                uVar55 = *puVar48 ^ *puVar49;
                uVar59 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                  }
                }
                uVar35 = ((uint)(uVar59 >> 3) & 0x1fffffff) + iVar52;
              }
              else {
                if ((puVar48 < puVar1) && ((uint)*puVar49 == (uint)*puVar48)) {
                  puVar48 = (ulong *)((long)puVar48 + 4);
                  puVar49 = (ulong *)((long)puVar49 + 4);
                }
                if ((puVar48 < puVar2) && ((short)*puVar49 == (short)*puVar48)) {
                  puVar48 = (ulong *)((long)puVar48 + 2);
                  puVar49 = (ulong *)((long)puVar49 + 2);
                }
                if (puVar48 < puVar20) {
                  puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar49 == (BYTE)*puVar48));
                }
                uVar35 = (int)puVar48 - (int)local_138;
              }
              goto LAB_001186f9;
            }
            if (*puVar49 == *puVar15) {
              puVar49 = (ulong *)(puVar42 + 3);
              puVar48 = puVar22;
              goto LAB_001185d5;
            }
            uVar55 = *puVar15 ^ *puVar49;
            uVar59 = 0;
            if (uVar55 != 0) {
              for (; (uVar55 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
              }
            }
            uVar35 = (uint)(uVar59 >> 3) & 0x1fffffff;
LAB_001186f9:
            uVar59 = (ulong)(uVar35 + 4);
            goto LAB_00118719;
          }
        }
        else if (*(uint *)(pLVar9 + uVar13) == uVar38) {
          puVar49 = (ulong *)((long)local_188 + (ulong)uVar35);
          if (puVar20 < puVar49) {
            puVar49 = puVar20;
          }
          puVar48 = (ulong *)(pLVar9 + uVar13 + 4);
          puVar41 = puVar15;
          if ((ulong *)((long)puVar49 + -7) <= puVar15) {
LAB_00118551:
            iVar52 = iVar24 + (int)puVar41;
LAB_0011855c:
            if (puVar41 < (ulong *)((long)puVar49 + -7)) {
              if (*puVar48 == *puVar41) goto code_r0x00118574;
              uVar55 = *puVar41 ^ *puVar48;
              uVar59 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                }
              }
              uVar43 = ((uint)(uVar59 >> 3) & 0x1fffffff) + iVar52;
            }
            else {
              if ((puVar41 < (ulong *)((long)puVar49 + -3)) && ((uint)*puVar48 == (uint)*puVar41)) {
                puVar41 = (ulong *)((long)puVar41 + 4);
                puVar48 = (ulong *)((long)puVar48 + 4);
              }
              if ((puVar41 < (ulong *)((long)puVar49 + -1)) && ((short)*puVar48 == (short)*puVar41))
              {
                puVar41 = (ulong *)((long)puVar41 + 2);
                puVar48 = (ulong *)((long)puVar48 + 2);
              }
              if (puVar41 < puVar49) {
                puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar41));
              }
              uVar43 = (int)puVar41 - (int)local_138;
            }
            goto LAB_0011863c;
          }
          if (*puVar48 == *puVar15) {
            puVar48 = (ulong *)(pLVar9 + uVar13 + 0xc);
            puVar41 = puVar22;
            goto LAB_00118551;
          }
          uVar55 = *puVar15 ^ *puVar48;
          uVar59 = 0;
          if (uVar55 != 0) {
            for (; (uVar55 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
            }
          }
          uVar43 = (uint)(uVar59 >> 3) & 0x1fffffff;
LAB_0011863c:
          uVar59 = (ulong)(uVar43 + 4);
          if ((puVar49 < puVar20) && ((ulong *)((long)local_188 + (long)(int)uVar43 + 4) == puVar49)
             ) {
            puVar48 = puVar49;
            puVar41 = puVar60;
            if (puVar39 <= puVar49) {
LAB_00118694:
              puVar40 = (ulong *)((ulong)uVar35 + (long)puVar33);
              if (puVar20 < puVar40) {
                puVar40 = puVar20;
              }
              iVar52 = (int)puVar48 - (int)puVar40;
LAB_001186ab:
              if (puVar48 < puVar39) {
                if (*puVar41 == *puVar48) goto code_r0x001186c1;
                uVar55 = *puVar48 ^ *puVar41;
                uVar59 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                  }
                }
                uVar35 = ((uint)(uVar59 >> 3) & 0x1fffffff) + iVar52;
              }
              else {
                if ((puVar48 < puVar1) && ((uint)*puVar41 == (uint)*puVar48)) {
                  puVar48 = (ulong *)((long)puVar48 + 4);
                  puVar41 = (ulong *)((long)puVar41 + 4);
                }
                if ((puVar48 < puVar2) && ((short)*puVar41 == (short)*puVar48)) {
                  puVar48 = (ulong *)((long)puVar48 + 2);
                  puVar41 = (ulong *)((long)puVar41 + 2);
                }
                if (puVar48 < puVar20) {
                  puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar48));
                }
                uVar35 = (int)puVar48 - (int)puVar49;
              }
              goto LAB_0011870c;
            }
            if (*puVar60 == *puVar49) {
              puVar48 = puVar49 + 1;
              puVar41 = puVar3;
              goto LAB_00118694;
            }
            uVar55 = *puVar49 ^ *puVar60;
            uVar59 = 0;
            if (uVar55 != 0) {
              for (; (uVar55 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
              }
            }
            uVar35 = (uint)(uVar59 >> 3) & 0x1fffffff;
LAB_0011870c:
            uVar59 = (ulong)(uVar43 + 4 + uVar35);
          }
LAB_00118719:
          if (iVar45 < (int)uVar59) {
            uVar14 = uVar59;
            local_1c0 = pLVar8 + uVar13;
          }
        }
      }
      iVar45 = 0x10;
      iVar36 = iVar36 + -1;
      iVar52 = (int)uVar14;
      if (((int)uVar59 == iVar52) && (uVar32 + iVar52 <= uVar47)) {
        uVar35 = 1;
        for (iVar37 = 0; iVar37 < (int)uVar59 + -3; iVar37 = iVar44 + iVar37) {
          uVar4 = ctx->chainTable[iVar37 + uVar32 & 0xffff];
          iVar44 = iVar45 >> 4;
          bVar61 = uVar35 < uVar4;
          if (uVar35 <= uVar4) {
            uVar35 = (uint)uVar4;
          }
          iVar45 = iVar45 + 1;
          if (bVar61) {
            iVar45 = 0x10;
            iVar46 = iVar37;
          }
        }
        bVar61 = uVar32 < uVar35;
        uVar43 = uVar35;
        if (uVar32 < uVar35) {
          uVar43 = 0;
        }
        if (uVar35 < 2) goto LAB_001187a1;
        uVar13 = (ulong)(uVar32 - uVar43);
        uVar14 = uVar59;
LAB_001187fc:
        uVar59 = uVar14 & 0xffffffff;
        if (bVar61) goto LAB_00118b99;
        goto LAB_001184ab;
      }
LAB_001187a1:
      uVar59 = uVar14;
      if ((ctx->chainTable[uVar13 & 0xffff] == 1) && (iVar46 == 0)) {
        if (iVar54 == 0) {
          iVar54 = 1;
          if (uVar38 >> 0x18 != (uVar38 & 0xff) || uVar38 >> 0x10 != (uVar38 & 0xffff))
          goto LAB_001188ca;
          uVar35 = LZ4HC_countPattern((BYTE *)puVar15,(BYTE *)puVar20,uVar38);
          local_198 = (ulong)uVar35 + 4;
          iVar54 = 2;
        }
        if ((iVar54 == 2) && (uVar35 = uVar32 - 1, uVar31 <= uVar35)) {
          if (uVar35 - uVar5 < 0xfffffffd) {
            pLVar58 = pLVar9;
            if (uVar5 <= uVar35) {
              pLVar58 = pLVar8;
            }
            if (*(uint *)(pLVar58 + uVar35) == uVar38) {
              pBVar56 = pLVar58 + uVar35;
              puVar49 = ip;
              if (uVar5 <= uVar35) {
                puVar49 = puVar20;
              }
              uVar32 = LZ4HC_countPattern(pBVar56 + 4,(BYTE *)puVar49,uVar38);
              local_110 = (ulong)uVar32 + 4;
              puVar49 = puVar60;
              if ((uVar35 < uVar5) && (puVar49 = iLow, (ulong *)(pBVar56 + local_110) == ip)) {
                bVar10 = (char)uVar32 * '\b' & 0x1f;
                UVar11 = uVar38 << bVar10 | uVar38 >> 0x20 - bVar10;
                if ((uVar32 & 3) == 0) {
                  UVar11 = uVar38;
                }
                uVar32 = LZ4HC_countPattern((BYTE *)puVar60,(BYTE *)puVar20,UVar11);
                local_110 = local_110 + uVar32;
              }
              uVar32 = LZ4HC_reverseCountPattern(pBVar56,(BYTE *)puVar49,uVar38);
              if ((uVar6 < uVar5 && uVar5 <= uVar35) &&
                  (ulong *)(pBVar56 + -(ulong)uVar32) == puVar60) {
                bVar10 = (char)uVar32 * -8 & 0x1f;
                UVar11 = uVar38 << bVar10 | uVar38 >> 0x20 - bVar10;
                if ((-uVar32 & 3) == 0) {
                  UVar11 = uVar38;
                }
                uVar43 = LZ4HC_reverseCountPattern((BYTE *)ip,(BYTE *)iLow,UVar11);
                uVar32 = uVar32 + uVar43;
              }
              uVar43 = uVar35 - uVar32;
              if (uVar35 - uVar32 <= uVar31) {
                uVar43 = uVar31;
              }
              uVar13 = (uVar35 - uVar43) + local_110;
              if ((local_110 <= local_198) && (local_198 <= uVar13)) {
                uVar32 = (uVar35 - (int)local_198) + (int)local_110;
                uVar13 = (ulong)uVar32;
                if (0xfffffffc < uVar32 - uVar5) {
                  uVar13 = uVar50;
                }
                iVar46 = 0;
                iVar54 = 2;
                goto LAB_001184ab;
              }
              bVar61 = false;
              if (uVar43 - uVar5 < 0xfffffffd) {
                if (local_198 <= uVar13) {
                  uVar13 = local_198;
                }
                if ((ulong)(long)iVar52 < uVar13) {
                  if (0xffff < uVar29 - uVar43) goto LAB_00118b99;
                  local_1c0 = pLVar8 + uVar43;
                  uVar14 = uVar13;
                }
                bVar61 = false;
                iVar54 = 2;
                iVar46 = 0;
                uVar13 = (ulong)(uVar43 - ctx->chainTable[(ulong)uVar43 & 0xffff]);
                if (ctx->chainTable[(ulong)uVar43 & 0xffff] <= uVar43) goto LAB_001187fc;
                goto LAB_00118b99;
              }
              iVar54 = 2;
              iVar46 = 0;
              uVar13 = uVar50;
              goto LAB_001187fc;
            }
          }
          iVar54 = 2;
        }
      }
LAB_001188ca:
      uVar13 = (ulong)(uVar32 - ctx->chainTable[iVar46 + uVar32 & 0xffff]);
      goto LAB_001184ab;
    }
    goto LAB_0011aa6d;
  }
  local_48 = 0;
  goto LAB_0011ab80;
code_r0x001185f9:
  puVar48 = puVar48 + 1;
  puVar49 = puVar49 + 1;
  iVar52 = iVar52 + 8;
  goto LAB_001185df;
code_r0x00118574:
  puVar41 = puVar41 + 1;
  puVar48 = puVar48 + 1;
  iVar52 = iVar52 + 8;
  goto LAB_0011855c;
code_r0x001186c1:
  puVar48 = puVar48 + 1;
  puVar41 = puVar41 + 1;
  iVar52 = iVar52 + 8;
  goto LAB_001186ab;
LAB_00118b99:
  uVar32 = (uint)uVar14;
  if (((dict == usingDictCtxHc) && (0 < iVar36)) && (uVar47 - uVar31 < 0xffff)) {
    pLVar58 = pLVar7->base;
    lVar21 = (long)pLVar7->end - (long)pLVar58;
    uVar27 = pLVar7->hashTable[uVar27];
    uVar31 = (uVar31 + uVar27) - (int)lVar21;
    while ((uVar32 = (uint)uVar14, uVar47 - uVar31 < 0x10000 &&
           (bVar61 = iVar36 != 0, iVar36 = iVar36 + -1, bVar61))) {
      uVar13 = (ulong)uVar27;
      if (*(uint *)(pLVar58 + uVar13) == uVar38) {
        puVar49 = (ulong *)((lVar21 - uVar13) + (long)local_188);
        if (puVar20 < puVar49) {
          puVar49 = puVar20;
        }
        puVar48 = (ulong *)(pLVar58 + uVar13 + 4);
        puVar41 = puVar15;
        if ((ulong *)((long)puVar49 + -7) <= puVar15) {
LAB_00118c6c:
          iVar54 = iVar24 + (int)puVar41;
LAB_00118c77:
          if (puVar41 < (ulong *)((long)puVar49 + -7)) {
            if (*puVar48 == *puVar41) goto code_r0x00118c87;
            uVar29 = *puVar41 ^ *puVar48;
            uVar13 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            uVar35 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar54;
          }
          else {
            if ((puVar41 < (ulong *)((long)puVar49 + -3)) && ((uint)*puVar48 == (uint)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 4);
              puVar48 = (ulong *)((long)puVar48 + 4);
            }
            if ((puVar41 < (ulong *)((long)puVar49 + -1)) && ((short)*puVar48 == (short)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 2);
              puVar48 = (ulong *)((long)puVar48 + 2);
            }
            if (puVar41 < puVar49) {
              puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar41));
            }
            uVar35 = (int)puVar41 - (int)local_138;
          }
          goto LAB_00118cae;
        }
        if (*puVar48 == *puVar15) {
          puVar48 = (ulong *)(pLVar58 + uVar13 + 0xc);
          puVar41 = puVar22;
          goto LAB_00118c6c;
        }
        uVar29 = *puVar15 ^ *puVar48;
        uVar13 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        uVar35 = (uint)(uVar13 >> 3) & 0x1fffffff;
LAB_00118cae:
        if ((int)uVar32 < (int)(uVar35 + 4)) {
          local_1c0 = pLVar8 + uVar31;
          uVar14 = (ulong)(uVar35 + 4);
        }
      }
      uVar32 = uVar27 & 0xffff;
      uVar27 = uVar27 - pLVar7->chainTable[uVar32];
      uVar31 = uVar31 - pLVar7->chainTable[uVar32];
    }
  }
  if (3 < (int)uVar32) goto LAB_00118dae;
  local_188 = (ulong *)((long)local_188 + 1);
  iVar24 = iVar24 + -1;
  puVar33 = (ulong *)((long)puVar33 + 1);
  uVar12 = uVar12 + 1;
  iVar26 = iVar26 + 1;
  iVar25 = iVar25 + -1;
  goto LAB_0011830d;
code_r0x00118c87:
  puVar41 = puVar41 + 1;
  puVar48 = puVar48 + 1;
  iVar54 = iVar54 + 8;
  goto LAB_00118c77;
code_r0x00119c50:
  puVar48 = puVar48 + 1;
  puVar49 = puVar49 + 1;
  iVar36 = iVar36 + 8;
  goto LAB_00119c36;
code_r0x00119bcf:
  puVar41 = puVar41 + 1;
  puVar48 = puVar48 + 1;
  iVar36 = iVar36 + 8;
  goto LAB_00119bb7;
code_r0x00119d06:
  puVar48 = puVar48 + 1;
  puVar41 = puVar41 + 1;
  iVar36 = iVar36 + 8;
  goto LAB_00119cf0;
LAB_0011a251:
  uVar27 = (uint)uVar55;
  if (((dict == usingDictCtxHc) && (0 < iVar24)) && (uVar38 - uVar47 < 0xffff)) {
    pLVar58 = pLVar7->base;
    lVar34 = (long)pLVar7->end - (long)pLVar58;
    uVar31 = pLVar7->hashTable[uVar31];
    uVar47 = (uVar47 + uVar31) - (int)lVar34;
    while( true ) {
      uVar27 = (uint)uVar55;
      if ((0xffff < uVar38 - uVar47) || (bVar61 = iVar24 == 0, iVar24 = iVar24 + -1, bVar61)) break;
      uVar29 = (ulong)uVar31;
      if (*(uint *)(pLVar58 + uVar29) == uVar12) {
        puVar49 = (ulong *)((lVar34 - uVar29) + (long)puVar33);
        if (puVar20 < puVar49) {
          puVar49 = puVar20;
        }
        puVar48 = (ulong *)(pLVar58 + uVar29 + 4);
        puVar41 = puVar15;
        if ((ulong *)((long)puVar49 + -7) <= puVar15) {
LAB_0011a339:
          iVar28 = iVar25 + (int)puVar41;
LAB_0011a344:
          if (puVar41 < (ulong *)((long)puVar49 + -7)) {
            if (*puVar48 == *puVar41) goto code_r0x0011a354;
            uVar59 = *puVar41 ^ *puVar48;
            uVar29 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar32 = ((uint)(uVar29 >> 3) & 0x1fffffff) + iVar28;
          }
          else {
            if ((puVar41 < (ulong *)((long)puVar49 + -3)) && ((uint)*puVar48 == (uint)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 4);
              puVar48 = (ulong *)((long)puVar48 + 4);
            }
            if ((puVar41 < (ulong *)((long)puVar49 + -1)) && ((short)*puVar48 == (short)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 2);
              puVar48 = (ulong *)((long)puVar48 + 2);
            }
            if (puVar41 < puVar49) {
              puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar41));
            }
            uVar32 = (int)puVar41 - (int)local_198;
          }
          goto LAB_0011a383;
        }
        if (*puVar48 == *puVar15) {
          puVar48 = (ulong *)(pLVar58 + uVar29 + 0xc);
          puVar41 = puVar22;
          goto LAB_0011a339;
        }
        uVar59 = *puVar15 ^ *puVar48;
        uVar29 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar32 = (uint)(uVar29 >> 3) & 0x1fffffff;
LAB_0011a383:
        if ((int)uVar27 < (int)(uVar32 + 4)) {
          local_190 = pLVar8 + uVar47;
          uVar55 = (ulong)(uVar32 + 4);
        }
      }
      uVar27 = uVar31 & 0xffff;
      uVar31 = uVar31 - pLVar7->chainTable[uVar27];
      uVar47 = uVar47 - pLVar7->chainTable[uVar27];
    }
  }
  if ((int)uVar27 <= (int)local_1a8 - local_150) goto LAB_0011a6ec;
  uVar29 = (ulong)uVar27;
  if (uVar27 - 0x13 < 0x12) {
    uVar29 = 0x12;
  }
  if (favorDecSpeed == favorCompressionRatio) {
    uVar29 = (ulong)uVar27;
  }
  if ((int)uVar29 == 0) goto LAB_0011a6ec;
  goto LAB_0011a448;
code_r0x0011a354:
  puVar41 = puVar41 + 1;
  puVar48 = puVar48 + 1;
  iVar28 = iVar28 + 8;
  goto LAB_0011a344;
code_r0x00119279:
  puVar48 = puVar48 + 1;
  puVar49 = puVar49 + 1;
  iVar36 = iVar36 + 8;
  goto LAB_0011925f;
code_r0x001191ec:
  puVar41 = puVar41 + 1;
  puVar48 = puVar48 + 1;
  iVar36 = iVar36 + 8;
  goto LAB_001191d4;
code_r0x0011932d:
  puVar48 = puVar48 + 1;
  puVar41 = puVar41 + 1;
  iVar36 = iVar36 + 8;
  goto LAB_00119317;
LAB_00119894:
  uVar27 = (uint)uVar55;
  if (((dict == usingDictCtxHc) && (0 < iVar28)) && (uVar38 - uVar47 < 0xffff)) {
    pLVar58 = pLVar7->base;
    lVar34 = (long)pLVar7->end - (long)pLVar58;
    uVar31 = pLVar7->hashTable[uVar31];
    uVar47 = (uVar47 + uVar31) - (int)lVar34;
    while ((uVar27 = (uint)uVar55, uVar38 - uVar47 < 0x10000 &&
           (bVar61 = iVar28 != 0, iVar28 = iVar28 + -1, bVar61))) {
      uVar29 = (ulong)uVar31;
      if (*(uint *)(pLVar58 + uVar29) == uVar12) {
        puVar49 = (ulong *)((lVar34 - uVar29) + (long)puVar33);
        if (puVar20 < puVar49) {
          puVar49 = puVar20;
        }
        puVar48 = (ulong *)(pLVar58 + uVar29 + 4);
        puVar41 = puVar15;
        if ((ulong *)((long)puVar49 + -7) <= puVar15) {
LAB_00119975:
          iVar24 = iVar25 + (int)puVar41;
LAB_00119980:
          if (puVar41 < (ulong *)((long)puVar49 + -7)) {
            if (*puVar48 == *puVar41) goto code_r0x00119990;
            uVar59 = *puVar41 ^ *puVar48;
            uVar29 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar32 = ((uint)(uVar29 >> 3) & 0x1fffffff) + iVar24;
          }
          else {
            if ((puVar41 < (ulong *)((long)puVar49 + -3)) && ((uint)*puVar48 == (uint)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 4);
              puVar48 = (ulong *)((long)puVar48 + 4);
            }
            if ((puVar41 < (ulong *)((long)puVar49 + -1)) && ((short)*puVar48 == (short)*puVar41)) {
              puVar41 = (ulong *)((long)puVar41 + 2);
              puVar48 = (ulong *)((long)puVar48 + 2);
            }
            if (puVar41 < puVar49) {
              puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar41));
            }
            uVar32 = (int)puVar41 - (int)local_190;
          }
          goto LAB_001199bf;
        }
        if (*puVar48 == *puVar15) {
          puVar48 = (ulong *)(pLVar58 + uVar29 + 0xc);
          puVar41 = puVar22;
          goto LAB_00119975;
        }
        uVar59 = *puVar15 ^ *puVar48;
        uVar29 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar32 = (uint)(uVar29 >> 3) & 0x1fffffff;
LAB_001199bf:
        if ((int)uVar27 < (int)(uVar32 + 4)) {
          local_1c8 = pLVar8 + uVar47;
          uVar55 = (ulong)(uVar32 + 4);
        }
      }
      uVar27 = uVar31 & 0xffff;
      uVar31 = uVar31 - pLVar7->chainTable[uVar27];
      uVar47 = uVar47 - pLVar7->chainTable[uVar27];
    }
  }
  if ((int)uVar27 < 4) goto LAB_0011a6ec;
  uVar29 = (ulong)uVar27;
  if (uVar27 - 0x13 < 0x12) {
    uVar29 = 0x12;
  }
  local_190 = local_1c8;
  if (favorDecSpeed == favorCompressionRatio) {
    uVar29 = (ulong)uVar27;
  }
LAB_0011a448:
  uVar59 = (long)puVar33 - (long)local_190;
  iVar28 = (int)uVar29;
  if ((uVar23 < (ulong)(long)iVar28) || (0xfff < iVar28 + local_150)) {
    local_1a8._0_4_ = local_150 + 1;
    goto LAB_0011a76f;
  }
  iVar24 = *(int *)((long)__ptr + lVar21 + 0xc);
  lVar21 = (long)iVar24;
  iVar54 = iVar24 + 1 + (iVar24 - 0xfU) / 0xff;
  iVar26 = iVar24;
  if (0xe < lVar21) {
    iVar26 = iVar54;
  }
  uVar12 = iVar24 - 0xe;
  iVar36 = 1;
  piVar53 = local_b8;
  for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
    if (lVar21 + 1 + lVar34 < 0xf) {
      iVar46 = iVar24 + iVar36;
    }
    else {
      iVar46 = uVar12 / 0xff + iVar24 + 2 + (int)lVar34;
    }
    iVar46 = (*piVar51 - iVar26) + iVar46;
    if (iVar46 < *piVar53) {
      piVar53[1] = 0;
      piVar53[2] = 1;
      piVar53[3] = iVar24 + (int)lVar34 + 1;
      *piVar53 = iVar46;
    }
    iVar36 = iVar36 + 1;
    piVar53 = piVar53 + 4;
    uVar12 = uVar12 + 1;
  }
  iVar26 = iVar24;
  if (0xe < iVar24) {
    iVar26 = iVar54;
  }
  piVar53 = local_a0;
  for (uVar14 = 4; (long)uVar14 <= (long)iVar28; uVar14 = uVar14 + 1) {
    iVar54 = (int)uVar14;
    if (piVar51[2] == 1) {
      iVar46 = 0;
      if (lVar21 < (long)uVar13) {
        iVar46 = *(int *)((long)(local_150 - iVar24) * 0x10 + (long)__ptr);
      }
      iVar36 = iVar26 + 3;
      if (0x12 < uVar14) {
        iVar36 = (iVar54 - 0x13U) / 0xff + iVar26 + 3 + 1;
      }
      iVar36 = iVar36 + iVar46;
      iVar46 = iVar24;
    }
    else {
      iVar36 = 3;
      if (0x12 < uVar14) {
        iVar36 = (iVar54 - 0x13U) / 0xff + 4;
      }
      iVar36 = iVar36 + *piVar51;
      iVar46 = 0;
    }
    uVar55 = (local_138 + uVar14) - 4;
    iVar45 = (int)uVar55;
    if (((int)local_1a8 + 3 < iVar45) || (iVar36 <= (int)(*piVar53 - favorDecSpeed))) {
      if (iVar45 < (int)local_1a8) {
        uVar55 = local_1a8;
      }
      if (uVar29 != uVar14) {
        uVar55 = local_1a8;
      }
      local_1a8 = uVar55 & 0xffffffff;
      piVar53[2] = iVar54;
      piVar53[1] = (int)uVar59;
      piVar53[3] = iVar46;
      *piVar53 = iVar36;
    }
    piVar53 = piVar53 + 4;
  }
  lVar21 = (long)(int)local_1a8 * 0x10;
  iVar28 = 1;
  for (lVar34 = 0; lVar34 != 0x30; lVar34 = lVar34 + 0x10) {
    *(undefined8 *)((long)__ptr + lVar34 + lVar21 + 0x14) = 0x100000000;
    *(int *)((long)__ptr + lVar34 + lVar21 + 0x1c) = iVar28;
    *(int *)((long)__ptr + lVar34 + lVar21 + 0x10) = *(int *)((long)__ptr + lVar21) + iVar28;
    iVar28 = iVar28 + 1;
  }
LAB_0011a6ec:
  uVar13 = uVar13 + 1;
  iVar25 = iVar25 + -1;
  local_a8 = (ulong *)((long)local_a8 + 1);
  local_b8 = local_b8 + 4;
  local_a0 = local_a0 + 4;
  local_138 = local_138 + 1;
  goto LAB_00118fb3;
code_r0x00119990:
  puVar41 = puVar41 + 1;
  puVar48 = puVar48 + 1;
  iVar24 = iVar24 + 8;
  goto LAB_00119980;
LAB_00118dae:
  uVar13 = (long)local_188 - (long)local_178;
  local_1a8 = (ulong)uVar32;
  if (uVar32 - 0x13 < 0x12) {
    local_1a8 = 0x12;
  }
  if (favorDecSpeed == favorCompressionRatio) {
    local_1a8 = (ulong)uVar32;
  }
  iVar24 = (int)uVar13;
  uVar38 = (uint)((long)local_188 - (long)local_1c0);
  if (local_1a8 <= uVar23) {
    piVar51 = (int *)((long)__ptr + 0xc);
    for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
      iVar54 = iVar24;
      if (0xe < iVar26 + lVar21) {
        iVar54 = uVar12 / 0xff + iVar28;
      }
      piVar51[-2] = 0;
      piVar51[-1] = 1;
      *piVar51 = ((int)puVar33 - (int)local_178) + (int)lVar21;
      piVar51[-3] = iVar54 + (int)lVar21;
      piVar51 = piVar51 + 4;
      uVar12 = uVar12 + 1;
    }
    iVar28 = iVar24 + 1 + (iVar24 - 0xfU) / 0xff;
    if (iVar24 < 0xf) {
      iVar28 = iVar24;
    }
    uVar12 = 0xfffffff1;
    piVar51 = (int *)((long)__ptr + 0x4c);
    for (uVar13 = 4; uVar13 <= local_1a8; uVar13 = uVar13 + 1) {
      iVar26 = iVar28 + 3;
      if (0x12 < uVar13) {
        iVar26 = uVar12 / 0xff + iVar28 + 3 + 1;
      }
      piVar51[-1] = (int)uVar13;
      piVar51[-2] = uVar38;
      *piVar51 = iVar24;
      piVar51[-3] = iVar26;
      uVar12 = uVar12 + 1;
      piVar51 = piVar51 + 4;
    }
    lVar21 = local_1a8 * 0x10;
    iVar28 = 1;
    for (lVar34 = 0; lVar34 != 0x30; lVar34 = lVar34 + 0x10) {
      *(undefined8 *)((long)__ptr + lVar34 + lVar21 + 0x14) = 0x100000000;
      *(int *)((long)__ptr + lVar34 + lVar21 + 0x1c) = iVar28;
      *(int *)((long)__ptr + lVar34 + lVar21 + 0x10) = *(int *)((long)__ptr + lVar21) + iVar28;
      iVar28 = iVar28 + 1;
    }
    local_138 = 5;
    uVar13 = 1;
    local_b8 = (int *)((long)__ptr + 0x20);
    local_a0 = (int *)((long)__ptr + 0x50);
LAB_00118fb3:
    if (((long)uVar13 < (long)(int)local_1a8) &&
       (puVar33 = (ulong *)((long)local_188 + uVar13), puVar33 <= puVar39)) {
      lVar21 = uVar13 * 0x10;
      piVar51 = (int *)((long)__ptr + lVar21);
      iVar28 = *(int *)((long)__ptr + lVar21);
      iVar24 = *(int *)((long)__ptr + lVar21 + 0x10);
      local_150 = (int)uVar13;
      if (fullUpdate == 0) {
        if (iVar28 < iVar24) {
          uVar59 = (long)puVar33 - (long)pLVar8;
          uVar38 = (uint)uVar59;
          uVar12 = (uint)*puVar33;
          for (uVar29 = (ulong)ctx->nextToUpdate; uVar29 < (uVar59 & 0xffffffff);
              uVar29 = uVar29 + 1) {
            uVar31 = (uint)(*(int *)(pLVar8 + uVar29) * -0x61c8864f) >> 0x11;
            uVar47 = (uint)uVar29;
            uVar27 = uVar47 - ctx->hashTable[uVar31];
            if (0xfffe < uVar27) {
              uVar27 = 0xffff;
            }
            ctx->chainTable[uVar47 & 0xffff] = (LZ4_u16)uVar27;
            ctx->hashTable[uVar31] = uVar47;
          }
          uVar47 = uVar38 - 0xffff;
          if (uVar38 < uVar18) {
            uVar47 = uVar6;
          }
          ctx->nextToUpdate = uVar38;
          uVar31 = (uint)*puVar33 * -0x61c8864f >> 0x11;
          uVar14 = (ulong)ctx->hashTable[uVar31];
          puVar15 = (ulong *)((long)puVar33 + 4);
          puVar22 = (ulong *)((long)puVar33 + 0xc);
          local_190 = (LZ4_byte *)0x0;
          local_118 = 0;
          iVar28 = 0;
          iVar26 = 0;
          uVar29 = (ulong)(uint)((int)local_1a8 - local_150);
          iVar24 = nbSearches;
LAB_00119b0b:
          uVar27 = (uint)uVar14;
          local_198._0_4_ = (int)puVar15;
          uVar55 = uVar29;
          if ((uVar27 < uVar47) || (iVar24 < 1)) goto LAB_0011a251;
          uVar55 = 0;
          if ((favorDecSpeed == favorCompressionRatio) || (7 < uVar38 - uVar27)) {
            uVar32 = uVar5 - uVar27;
            iVar54 = (int)uVar29;
            if (uVar5 < uVar27 || uVar32 == 0) {
              puVar42 = (uint *)(pLVar8 + uVar14);
              if ((*(short *)((long)puVar33 + (long)iVar54 + -1) ==
                   *(short *)((long)iVar54 + -1 + (long)puVar42)) && (*puVar42 == uVar12)) {
                puVar49 = (ulong *)(puVar42 + 1);
                puVar48 = puVar15;
                if (puVar39 <= puVar15) {
LAB_00119c2c:
                  iVar36 = iVar25 + (int)puVar48;
LAB_00119c36:
                  if (puVar48 < puVar39) {
                    if (*puVar49 == *puVar48) goto code_r0x00119c50;
                    uVar57 = *puVar48 ^ *puVar49;
                    uVar55 = 0;
                    if (uVar57 != 0) {
                      for (; (uVar57 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                      }
                    }
                    uVar35 = ((uint)(uVar55 >> 3) & 0x1fffffff) + iVar36;
                  }
                  else {
                    if ((puVar48 < puVar1) && ((uint)*puVar49 == (uint)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 4);
                      puVar49 = (ulong *)((long)puVar49 + 4);
                    }
                    if ((puVar48 < puVar2) && ((short)*puVar49 == (short)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 2);
                      puVar49 = (ulong *)((long)puVar49 + 2);
                    }
                    if (puVar48 < puVar20) {
                      puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar49 == (BYTE)*puVar48))
                      ;
                    }
                    uVar35 = (int)puVar48 - (int)local_198;
                  }
                  goto LAB_00119d4a;
                }
                if (*puVar49 == *puVar15) {
                  puVar49 = (ulong *)(puVar42 + 3);
                  puVar48 = puVar22;
                  goto LAB_00119c2c;
                }
                uVar57 = *puVar15 ^ *puVar49;
                uVar55 = 0;
                if (uVar57 != 0) {
                  for (; (uVar57 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                  }
                }
                uVar35 = (uint)(uVar55 >> 3) & 0x1fffffff;
LAB_00119d4a:
                uVar35 = uVar35 + 4;
                goto LAB_00119d72;
              }
            }
            else if (*(uint *)(pLVar9 + uVar14) == uVar12) {
              puVar49 = (ulong *)((ulong)uVar32 + (long)puVar33);
              if (puVar20 < puVar49) {
                puVar49 = puVar20;
              }
              puVar48 = (ulong *)(pLVar9 + uVar14 + 4);
              puVar41 = puVar15;
              if ((ulong *)((long)puVar49 + -7) <= puVar15) {
LAB_00119bac:
                iVar36 = iVar25 + (int)puVar41;
LAB_00119bb7:
                if (puVar41 < (ulong *)((long)puVar49 + -7)) {
                  if (*puVar48 == *puVar41) goto code_r0x00119bcf;
                  uVar57 = *puVar41 ^ *puVar48;
                  uVar55 = 0;
                  if (uVar57 != 0) {
                    for (; (uVar57 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                    }
                  }
                  uVar43 = ((uint)(uVar55 >> 3) & 0x1fffffff) + iVar36;
                }
                else {
                  if ((puVar41 < (ulong *)((long)puVar49 + -3)) &&
                     ((uint)*puVar48 == (uint)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 4);
                    puVar48 = (ulong *)((long)puVar48 + 4);
                  }
                  if ((puVar41 < (ulong *)((long)puVar49 + -1)) &&
                     ((short)*puVar48 == (short)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 2);
                    puVar48 = (ulong *)((long)puVar48 + 2);
                  }
                  if (puVar41 < puVar49) {
                    puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar41));
                  }
                  uVar43 = (int)puVar41 - (int)local_198;
                }
                goto LAB_00119c8b;
              }
              if (*puVar48 == *puVar15) {
                puVar48 = (ulong *)(pLVar9 + uVar14 + 0xc);
                puVar41 = puVar22;
                goto LAB_00119bac;
              }
              uVar57 = *puVar15 ^ *puVar48;
              uVar55 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                }
              }
              uVar43 = (uint)(uVar55 >> 3) & 0x1fffffff;
LAB_00119c8b:
              uVar35 = uVar43 + 4;
              if ((puVar49 < puVar20) &&
                 ((ulong *)((long)puVar33 + (long)(int)uVar43 + 4) == puVar49)) {
                puVar48 = puVar49;
                puVar41 = puVar60;
                if (puVar39 <= puVar49) {
LAB_00119cd6:
                  puVar40 = (ulong *)((ulong)uVar32 + (long)local_a8);
                  if (puVar20 < puVar40) {
                    puVar40 = puVar20;
                  }
                  iVar36 = (int)puVar48 - (int)puVar40;
LAB_00119cf0:
                  if (puVar48 < puVar39) {
                    if (*puVar41 == *puVar48) goto code_r0x00119d06;
                    uVar57 = *puVar48 ^ *puVar41;
                    uVar55 = 0;
                    if (uVar57 != 0) {
                      for (; (uVar57 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                      }
                    }
                    uVar32 = ((uint)(uVar55 >> 3) & 0x1fffffff) + iVar36;
                  }
                  else {
                    if ((puVar48 < puVar1) && ((uint)*puVar41 == (uint)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar48 < puVar2) && ((short)*puVar41 == (short)*puVar48)) {
                      puVar48 = (ulong *)((long)puVar48 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar48 < puVar20) {
                      puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar48))
                      ;
                    }
                    uVar32 = (int)puVar48 - (int)puVar49;
                  }
                  goto LAB_00119d6a;
                }
                if (*puVar60 == *puVar49) {
                  puVar48 = puVar49 + 1;
                  puVar41 = puVar3;
                  goto LAB_00119cd6;
                }
                uVar57 = *puVar49 ^ *puVar60;
                uVar55 = 0;
                if (uVar57 != 0) {
                  for (; (uVar57 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                  }
                }
                uVar32 = (uint)(uVar55 >> 3) & 0x1fffffff;
LAB_00119d6a:
                uVar35 = uVar35 + uVar32;
              }
LAB_00119d72:
              uVar55 = (ulong)uVar35;
              if (iVar54 < (int)uVar35) {
                uVar29 = uVar55;
                local_190 = pLVar8 + uVar14;
              }
            }
          }
          iVar24 = iVar24 + -1;
          iVar54 = (int)uVar29;
          if (((int)uVar55 == iVar54) && (iVar54 + uVar27 <= uVar38)) {
            uVar32 = 1;
            iVar46 = 0;
            iVar36 = 0x10;
            while (iVar46 < (int)uVar55 + -3) {
              uVar4 = ctx->chainTable[iVar46 + uVar27 & 0xffff];
              iVar45 = iVar36 + 1;
              bVar61 = uVar32 < uVar4;
              if (uVar32 <= uVar4) {
                uVar32 = (uint)uVar4;
              }
              if (bVar61) {
                iVar45 = 0x10;
                iVar26 = iVar46;
              }
              iVar46 = (iVar36 >> 4) + iVar46;
              iVar36 = iVar45;
            }
            bVar61 = uVar27 < uVar32;
            uVar35 = uVar32;
            if (uVar27 < uVar32) {
              uVar35 = 0;
            }
            if (uVar32 < 2) goto LAB_00119dfa;
            uVar14 = (ulong)(uVar27 - uVar35);
LAB_00119e62:
            uVar29 = uVar55 & 0xffffffff;
            if (bVar61) goto LAB_0011a251;
            goto LAB_00119b0b;
          }
LAB_00119dfa:
          if ((ctx->chainTable[uVar14 & 0xffff] == 1) && (iVar26 == 0)) {
            if (iVar28 == 0) {
              iVar28 = 1;
              if (uVar12 >> 0x18 != (uVar12 & 0xff) || uVar12 >> 0x10 != (uVar12 & 0xffff))
              goto LAB_00119f58;
              uVar32 = LZ4HC_countPattern((BYTE *)puVar15,(BYTE *)puVar20,uVar12);
              local_118 = (ulong)uVar32 + 4;
              iVar28 = 2;
            }
            if ((iVar28 == 2) && (uVar32 = uVar27 - 1, uVar47 <= uVar32)) {
              if (uVar32 - uVar5 < 0xfffffffd) {
                pLVar58 = pLVar9;
                if (uVar5 <= uVar32) {
                  pLVar58 = pLVar8;
                }
                if (*(uint *)(pLVar58 + uVar32) == uVar12) {
                  pBVar56 = pLVar58 + uVar32;
                  puVar49 = ip;
                  if (uVar5 <= uVar32) {
                    puVar49 = puVar20;
                  }
                  uVar27 = LZ4HC_countPattern(pBVar56 + 4,(BYTE *)puVar49,uVar12);
                  local_1c8 = (LZ4_byte *)((ulong)uVar27 + 4);
                  puVar49 = puVar60;
                  if ((uVar32 < uVar5) &&
                     (puVar49 = iLow, (ulong *)(pBVar56 + (long)local_1c8) == ip)) {
                    bVar10 = (char)uVar27 * '\b' & 0x1f;
                    UVar11 = uVar12 << bVar10 | uVar12 >> 0x20 - bVar10;
                    if ((uVar27 & 3) == 0) {
                      UVar11 = uVar12;
                    }
                    uVar27 = LZ4HC_countPattern((BYTE *)puVar60,(BYTE *)puVar20,UVar11);
                    local_1c8 = (LZ4_byte *)((long)local_1c8 + (ulong)uVar27);
                  }
                  uVar27 = LZ4HC_reverseCountPattern(pBVar56,(BYTE *)puVar49,uVar12);
                  if ((uVar6 < uVar5 && uVar5 <= uVar32) &&
                      (ulong *)(pBVar56 + -(ulong)uVar27) == puVar60) {
                    bVar10 = (char)uVar27 * -8 & 0x1f;
                    UVar11 = uVar12 << bVar10 | uVar12 >> 0x20 - bVar10;
                    if ((-uVar27 & 3) == 0) {
                      UVar11 = uVar12;
                    }
                    uVar35 = LZ4HC_reverseCountPattern((BYTE *)ip,(BYTE *)iLow,UVar11);
                    uVar27 = uVar27 + uVar35;
                  }
                  uVar35 = uVar32 - uVar27;
                  if (uVar32 - uVar27 <= uVar47) {
                    uVar35 = uVar47;
                  }
                  uVar14 = (ulong)(uVar32 - uVar35) + (long)local_1c8;
                  if ((local_1c8 <= local_118) && (local_118 <= uVar14)) {
                    uVar27 = (uVar32 - (int)local_118) + (int)local_1c8;
                    uVar14 = (ulong)uVar27;
                    if (0xfffffffc < uVar27 - uVar5) {
                      uVar14 = uVar50;
                    }
                    iVar26 = 0;
                    iVar28 = 2;
                    goto LAB_00119b0b;
                  }
                  bVar61 = false;
                  uVar55 = uVar29;
                  if (uVar35 - uVar5 < 0xfffffffd) {
                    if (local_118 <= uVar14) {
                      uVar14 = local_118;
                    }
                    if ((ulong)(long)iVar54 < uVar14) {
                      if (0xffff < uVar59 - uVar35) goto LAB_0011a251;
                      local_190 = pLVar8 + uVar35;
                      uVar29 = uVar14;
                    }
                    bVar61 = false;
                    iVar28 = 2;
                    iVar26 = 0;
                    uVar14 = (ulong)(uVar35 - ctx->chainTable[(ulong)uVar35 & 0xffff]);
                    uVar55 = uVar29;
                    if (ctx->chainTable[(ulong)uVar35 & 0xffff] <= uVar35) goto LAB_00119e62;
                    goto LAB_0011a251;
                  }
                  iVar28 = 2;
                  iVar26 = 0;
                  uVar14 = uVar50;
                  goto LAB_00119e62;
                }
              }
              iVar28 = 2;
            }
          }
LAB_00119f58:
          uVar14 = (ulong)(uVar27 - ctx->chainTable[uVar27 + iVar26 & 0xffff]);
          goto LAB_00119b0b;
        }
      }
      else if ((iVar28 < iVar24) || (iVar28 + 3 <= piVar51[0x10])) {
        uVar59 = (long)puVar33 - (long)pLVar8;
        uVar38 = (uint)uVar59;
        uVar12 = (uint)*puVar33;
        for (uVar29 = (ulong)ctx->nextToUpdate; uVar29 < (uVar59 & 0xffffffff); uVar29 = uVar29 + 1)
        {
          uVar31 = (uint)(*(int *)(pLVar8 + uVar29) * -0x61c8864f) >> 0x11;
          uVar47 = (uint)uVar29;
          uVar27 = uVar47 - ctx->hashTable[uVar31];
          if (0xfffe < uVar27) {
            uVar27 = 0xffff;
          }
          ctx->chainTable[uVar47 & 0xffff] = (LZ4_u16)uVar27;
          ctx->hashTable[uVar31] = uVar47;
        }
        uVar47 = uVar38 - 0xffff;
        if (uVar38 < uVar18) {
          uVar47 = uVar6;
        }
        ctx->nextToUpdate = uVar38;
        uVar31 = (uint)*puVar33 * -0x61c8864f >> 0x11;
        uVar14 = (ulong)ctx->hashTable[uVar31];
        puVar15 = (ulong *)((long)puVar33 + 4);
        puVar22 = (ulong *)((long)puVar33 + 0xc);
        local_1c8 = (LZ4_byte *)0x0;
        local_118 = 0;
        iVar24 = 0;
        iVar26 = 0;
        uVar29 = 3;
        iVar28 = nbSearches;
LAB_00119123:
        uVar55 = uVar29;
        uVar27 = (uint)uVar14;
        iVar54 = (int)uVar55;
        local_190._0_4_ = (int)puVar15;
        if ((uVar27 < uVar47) || (iVar28 < 1)) goto LAB_00119894;
        uVar29 = 0;
        if ((favorDecSpeed == favorCompressionRatio) || (7 < uVar38 - uVar27)) {
          uVar32 = uVar5 - uVar27;
          if (uVar5 < uVar27 || uVar32 == 0) {
            puVar42 = (uint *)(pLVar8 + uVar14);
            if ((*(short *)((long)puVar33 + (long)iVar54 + -1) ==
                 *(short *)((long)iVar54 + -1 + (long)puVar42)) && (*puVar42 == uVar12)) {
              puVar49 = (ulong *)(puVar42 + 1);
              puVar48 = puVar15;
              if (puVar39 <= puVar15) {
LAB_00119255:
                iVar36 = iVar25 + (int)puVar48;
LAB_0011925f:
                if (puVar48 < puVar39) {
                  if (*puVar49 == *puVar48) goto code_r0x00119279;
                  uVar57 = *puVar48 ^ *puVar49;
                  uVar29 = 0;
                  if (uVar57 != 0) {
                    for (; (uVar57 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar32 = ((uint)(uVar29 >> 3) & 0x1fffffff) + iVar36;
                }
                else {
                  if ((puVar48 < puVar1) && ((uint)*puVar49 == (uint)*puVar48)) {
                    puVar48 = (ulong *)((long)puVar48 + 4);
                    puVar49 = (ulong *)((long)puVar49 + 4);
                  }
                  if ((puVar48 < puVar2) && ((short)*puVar49 == (short)*puVar48)) {
                    puVar48 = (ulong *)((long)puVar48 + 2);
                    puVar49 = (ulong *)((long)puVar49 + 2);
                  }
                  if (puVar48 < puVar20) {
                    puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar49 == (BYTE)*puVar48));
                  }
                  uVar32 = (int)puVar48 - (int)local_190;
                }
                goto LAB_00119360;
              }
              if (*puVar49 == *puVar15) {
                puVar49 = (ulong *)(puVar42 + 3);
                puVar48 = puVar22;
                goto LAB_00119255;
              }
              uVar57 = *puVar15 ^ *puVar49;
              uVar29 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar32 = (uint)(uVar29 >> 3) & 0x1fffffff;
LAB_00119360:
              uVar29 = (ulong)(uVar32 + 4);
              goto LAB_0011937b;
            }
          }
          else if (*(uint *)(pLVar9 + uVar14) == uVar12) {
            puVar49 = (ulong *)((long)puVar33 + (ulong)uVar32);
            if (puVar20 < puVar49) {
              puVar49 = puVar20;
            }
            puVar48 = (ulong *)(pLVar9 + uVar14 + 4);
            puVar41 = puVar15;
            if ((ulong *)((long)puVar49 + -7) <= puVar15) {
LAB_001191c9:
              iVar36 = iVar25 + (int)puVar41;
LAB_001191d4:
              if (puVar41 < (ulong *)((long)puVar49 + -7)) {
                if (*puVar48 == *puVar41) goto code_r0x001191ec;
                uVar57 = *puVar41 ^ *puVar48;
                uVar29 = 0;
                if (uVar57 != 0) {
                  for (; (uVar57 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar35 = ((uint)(uVar29 >> 3) & 0x1fffffff) + iVar36;
              }
              else {
                if ((puVar41 < (ulong *)((long)puVar49 + -3)) && ((uint)*puVar48 == (uint)*puVar41))
                {
                  puVar41 = (ulong *)((long)puVar41 + 4);
                  puVar48 = (ulong *)((long)puVar48 + 4);
                }
                if ((puVar41 < (ulong *)((long)puVar49 + -1)) &&
                   ((short)*puVar48 == (short)*puVar41)) {
                  puVar41 = (ulong *)((long)puVar41 + 2);
                  puVar48 = (ulong *)((long)puVar48 + 2);
                }
                if (puVar41 < puVar49) {
                  puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar41));
                }
                uVar35 = (int)puVar41 - (int)local_190;
              }
              goto LAB_001192a5;
            }
            if (*puVar48 == *puVar15) {
              puVar48 = (ulong *)(pLVar9 + uVar14 + 0xc);
              puVar41 = puVar22;
              goto LAB_001191c9;
            }
            uVar57 = *puVar15 ^ *puVar48;
            uVar29 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar35 = (uint)(uVar29 >> 3) & 0x1fffffff;
LAB_001192a5:
            uVar29 = (ulong)(uVar35 + 4);
            if ((puVar49 < puVar20) && ((ulong *)((long)puVar33 + (long)(int)uVar35 + 4) == puVar49)
               ) {
              puVar48 = puVar49;
              puVar41 = puVar60;
              if (puVar39 <= puVar49) {
LAB_001192fd:
                puVar40 = (ulong *)((ulong)uVar32 + (long)local_a8);
                if (puVar20 < puVar40) {
                  puVar40 = puVar20;
                }
                iVar36 = (int)puVar48 - (int)puVar40;
LAB_00119317:
                if (puVar48 < puVar39) {
                  if (*puVar41 == *puVar48) goto code_r0x0011932d;
                  uVar57 = *puVar48 ^ *puVar41;
                  uVar29 = 0;
                  if (uVar57 != 0) {
                    for (; (uVar57 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar32 = ((uint)(uVar29 >> 3) & 0x1fffffff) + iVar36;
                }
                else {
                  if ((puVar48 < puVar1) && ((uint)*puVar41 == (uint)*puVar48)) {
                    puVar48 = (ulong *)((long)puVar48 + 4);
                    puVar41 = (ulong *)((long)puVar41 + 4);
                  }
                  if ((puVar48 < puVar2) && ((short)*puVar41 == (short)*puVar48)) {
                    puVar48 = (ulong *)((long)puVar48 + 2);
                    puVar41 = (ulong *)((long)puVar41 + 2);
                  }
                  if (puVar48 < puVar20) {
                    puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar48));
                  }
                  uVar32 = (int)puVar48 - (int)puVar49;
                }
                goto LAB_00119373;
              }
              if (*puVar60 == *puVar49) {
                puVar48 = puVar49 + 1;
                puVar41 = puVar3;
                goto LAB_001192fd;
              }
              uVar57 = *puVar49 ^ *puVar60;
              uVar29 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar32 = (uint)(uVar29 >> 3) & 0x1fffffff;
LAB_00119373:
              uVar29 = (ulong)(uVar35 + 4 + uVar32);
            }
LAB_0011937b:
            if (iVar54 < (int)uVar29) {
              uVar55 = uVar29;
              local_1c8 = pLVar8 + uVar14;
            }
          }
        }
        iVar54 = 0x10;
        iVar28 = iVar28 + -1;
        iVar36 = (int)uVar55;
        if (((int)uVar29 == iVar36) && (iVar36 + uVar27 <= uVar38)) {
          uVar32 = 1;
          for (iVar46 = 0; iVar46 < (int)uVar29 + -3; iVar46 = iVar45 + iVar46) {
            uVar4 = ctx->chainTable[iVar46 + uVar27 & 0xffff];
            iVar45 = iVar54 >> 4;
            bVar61 = uVar32 < uVar4;
            if (uVar32 <= uVar4) {
              uVar32 = (uint)uVar4;
            }
            iVar54 = iVar54 + 1;
            if (bVar61) {
              iVar54 = 0x10;
              iVar26 = iVar46;
            }
          }
          bVar61 = uVar27 < uVar32;
          uVar35 = uVar32;
          if (uVar27 < uVar32) {
            uVar35 = 0;
          }
          if (uVar32 < 2) goto LAB_001193fd;
          uVar14 = (ulong)(uVar27 - uVar35);
          uVar55 = uVar29;
LAB_00119460:
          uVar29 = uVar55 & 0xffffffff;
          if (bVar61) goto LAB_00119894;
          goto LAB_00119123;
        }
LAB_001193fd:
        uVar29 = uVar55;
        if ((ctx->chainTable[uVar14 & 0xffff] == 1) && (iVar26 == 0)) {
          if (iVar24 == 0) {
            iVar24 = 1;
            if (uVar12 >> 0x18 != (uVar12 & 0xff) || uVar12 >> 0x10 != (uVar12 & 0xffff))
            goto LAB_00119543;
            uVar32 = LZ4HC_countPattern((BYTE *)puVar15,(BYTE *)puVar20,uVar12);
            local_118 = (ulong)uVar32 + 4;
            iVar24 = 2;
          }
          if (iVar24 == 2) {
            uVar32 = uVar27 - 1;
            if (uVar32 < uVar47) {
              iVar24 = 2;
            }
            else {
              if (uVar32 - uVar5 < 0xfffffffd) {
                pLVar58 = pLVar9;
                if (uVar5 <= uVar32) {
                  pLVar58 = pLVar8;
                }
                if (*(uint *)(pLVar58 + uVar32) == uVar12) {
                  pBVar56 = pLVar58 + uVar32;
                  puVar49 = ip;
                  if (uVar5 <= uVar32) {
                    puVar49 = puVar20;
                  }
                  uVar27 = LZ4HC_countPattern(pBVar56 + 4,(BYTE *)puVar49,uVar12);
                  local_1e8 = (ulong)uVar27 + 4;
                  puVar49 = puVar60;
                  if ((uVar32 < uVar5) && (puVar49 = iLow, (ulong *)(pBVar56 + local_1e8) == ip)) {
                    bVar10 = (char)uVar27 * '\b' & 0x1f;
                    UVar11 = uVar12 << bVar10 | uVar12 >> 0x20 - bVar10;
                    if ((uVar27 & 3) == 0) {
                      UVar11 = uVar12;
                    }
                    uVar27 = LZ4HC_countPattern((BYTE *)puVar60,(BYTE *)puVar20,UVar11);
                    local_1e8 = local_1e8 + uVar27;
                  }
                  uVar27 = LZ4HC_reverseCountPattern(pBVar56,(BYTE *)puVar49,uVar12);
                  if ((uVar6 < uVar5 && uVar5 <= uVar32) &&
                      (ulong *)(pBVar56 + -(ulong)uVar27) == puVar60) {
                    bVar10 = (char)uVar27 * -8 & 0x1f;
                    UVar11 = uVar12 << bVar10 | uVar12 >> 0x20 - bVar10;
                    if ((-uVar27 & 3) == 0) {
                      UVar11 = uVar12;
                    }
                    uVar35 = LZ4HC_reverseCountPattern((BYTE *)ip,(BYTE *)iLow,UVar11);
                    uVar27 = uVar27 + uVar35;
                  }
                  uVar35 = uVar32 - uVar27;
                  if (uVar32 - uVar27 <= uVar47) {
                    uVar35 = uVar47;
                  }
                  uVar14 = (uVar32 - uVar35) + local_1e8;
                  if ((local_1e8 <= local_118) && (local_118 <= uVar14)) {
                    uVar27 = (uVar32 - (int)local_118) + (int)local_1e8;
                    if (0xfffffffc < uVar27 - uVar5) {
                      uVar27 = uVar5;
                    }
                    iVar26 = 0;
                    iVar24 = 2;
                    uVar14 = (ulong)uVar27;
                    goto LAB_00119123;
                  }
                  bVar61 = false;
                  if (uVar35 - uVar5 < 0xfffffffd) {
                    if (local_118 <= uVar14) {
                      uVar14 = local_118;
                    }
                    if ((ulong)(long)iVar36 < uVar14) {
                      if (0xffff < uVar59 - uVar35) goto LAB_00119894;
                      local_1c8 = pLVar8 + uVar35;
                      uVar55 = uVar14;
                    }
                    bVar61 = false;
                    iVar24 = 2;
                    iVar26 = 0;
                    uVar14 = (ulong)(uVar35 - ctx->chainTable[(ulong)uVar35 & 0xffff]);
                    if (ctx->chainTable[(ulong)uVar35 & 0xffff] <= uVar35) goto LAB_00119460;
                    goto LAB_00119894;
                  }
                  iVar24 = 2;
                  iVar26 = 0;
                  uVar14 = uVar50;
                  goto LAB_00119460;
                }
              }
              iVar24 = 2;
            }
          }
        }
LAB_00119543:
        uVar14 = (ulong)(uVar27 - ctx->chainTable[uVar27 + iVar26 & 0xffff]);
        goto LAB_00119123;
      }
      goto LAB_0011a6ec;
    }
    lVar21 = (long)(int)local_1a8 * 0x10;
    uVar59 = (ulong)*(uint *)((long)__ptr + lVar21 + 4);
    uVar12 = *(uint *)((long)__ptr + lVar21 + 8);
    uVar29 = (ulong)uVar12;
    uVar13 = (ulong)((int)local_1a8 - uVar12);
LAB_0011a76f:
    do {
      iVar25 = (int)uVar13;
      lVar21 = (long)iVar25 * 0x10;
      uVar12 = *(uint *)((long)__ptr + lVar21 + 4);
      uVar5 = *(uint *)((long)__ptr + lVar21 + 8);
      *(int *)((long)__ptr + lVar21 + 8) = (int)uVar29;
      *(int *)((long)__ptr + lVar21 + 4) = (int)uVar59;
      uVar29 = (ulong)uVar5;
      uVar59 = (ulong)uVar12;
      uVar13 = (ulong)(iVar25 - uVar5);
    } while ((int)uVar5 <= iVar25);
    uVar13 = 0;
    while( true ) {
      BVar17 = (char)local_188 * '\x10' + (char)local_178 * -0x10;
      uVar29 = (long)local_188 - (long)local_178;
      puVar42 = (uint *)((long)__ptr + (long)(int)uVar13 * 0x10 + 8);
      lVar21 = 0;
      while( true ) {
        if ((int)local_1a8 <= (int)uVar13 + (int)lVar21) {
          local_188 = (ulong *)((long)local_188 + lVar21);
          goto LAB_001182c3;
        }
        uVar12 = *puVar42;
        if ((ulong)uVar12 != 1) break;
        lVar21 = lVar21 + 1;
        BVar17 = BVar17 + '\x10';
        uVar29 = uVar29 + 1;
        puVar42 = puVar42 + 4;
      }
      uVar38 = puVar42[-1];
      if ((limit != notLimited) &&
         (pBVar30 < token + (long)((long)local_188 + lVar21 + (uVar29 / 0xff - (long)local_178) + 9)
         )) break;
      if ((BYTE *)((long)local_188 + (lVar21 - (long)local_178)) < (BYTE *)0xf) {
        puVar33 = (ulong *)(token + 1);
        *token = BVar17;
      }
      else {
        *token = 0xf0;
        puVar33 = (ulong *)(token + 2);
        for (pBVar56 = (BYTE *)((long)local_188 + (lVar21 - (long)local_178) + -0xf);
            (BYTE *)0xfe < pBVar56; pBVar56 = pBVar56 + -0xff) {
          *(BYTE *)((long)puVar33 + -1) = 0xff;
          puVar33 = (ulong *)((long)puVar33 + 1);
        }
        *(BYTE *)((long)puVar33 + -1) = (BYTE)pBVar56;
      }
      lVar34 = (long)(int)uVar12;
      uVar13 = (uVar13 & 0xffffffff) + (ulong)uVar12 + lVar21;
      puVar60 = (ulong *)((long)puVar33 + (long)((long)local_188 + (lVar21 - (long)local_178)));
      puVar15 = local_178;
      puVar22 = puVar33;
      do {
        *puVar22 = *puVar15;
        puVar22 = puVar22 + 1;
        puVar15 = puVar15 + 1;
      } while (puVar22 < puVar60);
      uVar29 = lVar34 - 4;
      *(short *)puVar60 = (short)uVar38;
      if ((limit != notLimited) &&
         (pBVar30 < (BYTE *)((long)puVar33 +
                            (long)((long)local_188 + uVar29 / 0xff + (lVar21 - (long)local_178) + 8)
                            ))) break;
      pBVar56 = (BYTE *)((long)puVar33 + (long)((long)local_188 + (lVar21 - (long)local_178) + 2));
      if (uVar29 < 0xf) {
        *token = *token + (char)uVar29;
      }
      else {
        *token = *token + '\x0f';
        for (uVar29 = lVar34 - 0x13; 0x1fd < uVar29; uVar29 = uVar29 - 0x1fe) {
          pBVar56[0] = 0xff;
          pBVar56[1] = 0xff;
          pBVar56 = pBVar56 + 2;
        }
        if (0xfe < uVar29) {
          uVar29 = uVar29 - 0xff;
          *pBVar56 = 0xff;
          pBVar56 = pBVar56 + 1;
        }
        *pBVar56 = (BYTE)uVar29;
        pBVar56 = pBVar56 + 1;
      }
      local_188 = (ulong *)((long)local_188 + lVar21 + lVar34);
      local_178 = local_188;
      token = pBVar56;
    }
    local_188 = (ulong *)((long)local_188 + lVar21);
    goto LAB_0011abac;
  }
  if ((limit == notLimited) || (token + uVar13 + uVar13 / 0xff + 9 <= pBVar30)) {
    if (uVar13 < 0xf) {
      puVar33 = (ulong *)(token + 1);
      *token = (char)uVar13 << 4;
    }
    else {
      *token = 0xf0;
      puVar33 = (ulong *)(token + 2);
      for (uVar29 = uVar13 - 0xf; 0xfe < uVar29; uVar29 = uVar29 - 0xff) {
        *(undefined1 *)((long)puVar33 + -1) = 0xff;
        puVar33 = (ulong *)((long)puVar33 + 1);
      }
      *(char *)((long)puVar33 + -1) = (char)uVar29;
    }
    puVar22 = (ulong *)(uVar13 + (long)puVar33);
    puVar15 = local_178;
    do {
      *puVar33 = *puVar15;
      puVar33 = puVar33 + 1;
      puVar15 = puVar15 + 1;
    } while (puVar33 < puVar22);
    uVar13 = local_1a8 - 4;
    *(short *)puVar22 = (short)((long)local_188 - (long)local_1c0);
    if ((limit != notLimited) && (pBVar30 < (BYTE *)((long)puVar22 + uVar13 / 0xff + 8)))
    goto LAB_0011ab9d;
    pBVar56 = (BYTE *)((long)puVar22 + 2);
    if (uVar13 < 0xf) {
      *token = *token + (char)uVar13;
    }
    else {
      *token = *token + '\x0f';
      for (uVar13 = local_1a8 - 0x13; 0x1fd < uVar13; uVar13 = uVar13 - 0x1fe) {
        pBVar56[0] = 0xff;
        pBVar56[1] = 0xff;
        pBVar56 = pBVar56 + 2;
      }
      if (0xfe < uVar13) {
        uVar13 = uVar13 - 0xff;
        *pBVar56 = 0xff;
        pBVar56 = pBVar56 + 1;
      }
      *pBVar56 = (BYTE)uVar13;
      pBVar56 = pBVar56 + 1;
    }
    local_178 = (ulong *)((long)local_188 + local_1a8);
    local_188 = local_178;
    token = pBVar56;
    goto LAB_001182c3;
  }
LAB_0011ab9d:
  uVar12 = (uint)local_1a8;
LAB_0011abac:
  if (limit == fillOutput) {
    uVar23 = (long)local_188 - (long)local_178;
    pBVar56 = token + (uVar23 + 0xf0) / 0xff + uVar23 + 1;
    if (pBVar56 <= dst + (long)dstCapacity + -8) {
      uVar13 = ((long)(dst + (long)dstCapacity + -8) - (long)pBVar56) * 0xff + 0x12;
      if (uVar13 < (ulong)(long)(int)uVar12) {
        uVar12 = (uint)uVar13;
      }
      lVar21 = (long)(int)uVar12;
      if ((long)(pBVar56 + (2 - (long)(dst + lVar21 + dstCapacity))) < -0xc) {
        if (uVar23 < 0xf) {
          puVar20 = (ulong *)(token + 1);
          *token = (char)uVar23 << 4;
        }
        else {
          *token = 0xf0;
          puVar20 = (ulong *)(token + 2);
          for (uVar13 = uVar23 - 0xf; 0xfe < uVar13; uVar13 = uVar13 - 0xff) {
            *(undefined1 *)((long)puVar20 + -1) = 0xff;
            puVar20 = (ulong *)((long)puVar20 + 1);
          }
          *(char *)((long)puVar20 + -1) = (char)uVar13;
        }
        puVar39 = (ulong *)(uVar23 + (long)puVar20);
        do {
          *puVar20 = *local_178;
          puVar20 = puVar20 + 1;
          local_178 = local_178 + 1;
        } while (puVar20 < puVar39);
        *(short *)puVar39 = (short)uVar38;
        pBVar56 = (BYTE *)((long)puVar39 + 2);
        if (lVar21 - 4U < 0xf) {
          *token = *token + (char)(lVar21 - 4U);
        }
        else {
          *token = *token + '\x0f';
          for (uVar23 = lVar21 - 0x13; 0x1fd < uVar23; uVar23 = uVar23 - 0x1fe) {
            pBVar56[0] = 0xff;
            pBVar56[1] = 0xff;
            pBVar56 = pBVar56 + 2;
          }
          if (0xfe < uVar23) {
            uVar23 = uVar23 - 0xff;
            *pBVar56 = 0xff;
            pBVar56 = pBVar56 + 1;
          }
          *pBVar56 = (BYTE)uVar23;
          pBVar56 = pBVar56 + 1;
        }
        local_178 = (ulong *)((long)local_188 + lVar21);
        token = pBVar56;
      }
    }
LAB_0011aa6d:
    pBVar56 = (BYTE *)(source + (lVar19 - (long)local_178));
    if ((limit != notLimited) &&
       (pBVar30 = pBVar30 + (ulong)(limit == fillOutput) * 5,
       pBVar30 < token + (long)(pBVar56 + (ulong)(pBVar56 + 0xf0) / 0xff + 1))) {
      if (limit == limitedOutput) goto LAB_0011aad4;
      pBVar56 = pBVar30 + (~(ulong)token - ((ulong)(pBVar30 + ~(ulong)token + 0xf1) >> 8));
    }
    if (pBVar56 < (BYTE *)0xf) {
      *token = (char)pBVar56 << 4;
      pBVar30 = token + 1;
    }
    else {
      *token = 0xf0;
      pBVar30 = token + 2;
      for (pBVar16 = pBVar56 + -0xf; (BYTE *)0xfe < pBVar16; pBVar16 = pBVar16 + -0xff) {
        pBVar30[-1] = 0xff;
        pBVar30 = pBVar30 + 1;
      }
      pBVar30[-1] = (BYTE)pBVar16;
    }
    memcpy(pBVar30,local_178,(size_t)pBVar56);
    local_50 = (int)source;
    *srcSizePtr = ((int)local_178 + (int)pBVar56) - local_50;
    local_48 = (int)dst;
    local_48 = ((int)pBVar30 + (int)pBVar56) - local_48;
  }
  else {
LAB_0011aad4:
    local_48 = 0;
  }
LAB_0011ab80:
  free(__ptr);
  return local_48;
}

Assistant:

static int LZ4HC_compress_optimal ( LZ4HC_CCtx_internal* ctx,
                                    const char* const source,
                                    char* dst,
                                    int* srcSizePtr,
                                    int dstCapacity,
                                    int const nbSearches,
                                    size_t sufficient_len,
                                    const limitedOutput_directive limit,
                                    int const fullUpdate,
                                    const dictCtx_directive dict,
                                    const HCfavor_e favorDecSpeed)
{
    int retval = 0;
#define TRAILING_LITERALS 3
#ifdef LZ4HC_HEAPMODE
    LZ4HC_optimal_t* const opt = (LZ4HC_optimal_t*)ALLOC(sizeof(LZ4HC_optimal_t) * (LZ4_OPT_NUM + TRAILING_LITERALS));
#else
    LZ4HC_optimal_t opt[LZ4_OPT_NUM + TRAILING_LITERALS];   /* ~64 KB, which is a bit large for stack... */
#endif

    const BYTE* ip = (const BYTE*) source;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + *srcSizePtr;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = iend - LASTLITERALS;
    BYTE* op = (BYTE*) dst;
    BYTE* opSaved = (BYTE*) dst;
    BYTE* oend = op + dstCapacity;
    int ovml = MINMATCH;  /* overflow - last sequence */
    const BYTE* ovref = NULL;

    /* init */
#ifdef LZ4HC_HEAPMODE
    if (opt == NULL) goto _return_label;
#endif
    DEBUGLOG(5, "LZ4HC_compress_optimal(dst=%p, dstCapa=%u)", dst, (unsigned)dstCapacity);
    *srcSizePtr = 0;
    if (limit == fillOutput) oend -= LASTLITERALS;   /* Hack for support LZ4 format restriction */
    if (sufficient_len >= LZ4_OPT_NUM) sufficient_len = LZ4_OPT_NUM-1;

    /* Main Loop */
    while (ip <= mflimit) {
         int const llen = (int)(ip - anchor);
         int best_mlen, best_off;
         int cur, last_match_pos = 0;

         LZ4HC_match_t const firstMatch = LZ4HC_FindLongerMatch(ctx, ip, matchlimit, MINMATCH-1, nbSearches, dict, favorDecSpeed);
         if (firstMatch.len==0) { ip++; continue; }

         if ((size_t)firstMatch.len > sufficient_len) {
             /* good enough solution : immediate encoding */
             int const firstML = firstMatch.len;
             const BYTE* const matchPos = ip - firstMatch.off;
             opSaved = op;
             if ( LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), firstML, matchPos, limit, oend) ) {  /* updates ip, op and anchor */
                 ovml = firstML;
                 ovref = matchPos;
                 goto _dest_overflow;
             }
             continue;
         }

         /* set prices for first positions (literals) */
         {   int rPos;
             for (rPos = 0 ; rPos < MINMATCH ; rPos++) {
                 int const cost = LZ4HC_literalsPrice(llen + rPos);
                 opt[rPos].mlen = 1;
                 opt[rPos].off = 0;
                 opt[rPos].litlen = llen + rPos;
                 opt[rPos].price = cost;
                 DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i) -- initial setup",
                             rPos, cost, opt[rPos].litlen);
         }   }
         /* set prices using initial match */
         {   int mlen = MINMATCH;
             int const matchML = firstMatch.len;   /* necessarily < sufficient_len < LZ4_OPT_NUM */
             int const offset = firstMatch.off;
             assert(matchML < LZ4_OPT_NUM);
             for ( ; mlen <= matchML ; mlen++) {
                 int const cost = LZ4HC_sequencePrice(llen, mlen);
                 opt[mlen].mlen = mlen;
                 opt[mlen].off = offset;
                 opt[mlen].litlen = llen;
                 opt[mlen].price = cost;
                 DEBUGLOG(7, "rPos:%3i => price:%3i (matchlen=%i) -- initial setup",
                             mlen, cost, mlen);
         }   }
         last_match_pos = firstMatch.len;
         {   int addLit;
             for (addLit = 1; addLit <= TRAILING_LITERALS; addLit ++) {
                 opt[last_match_pos+addLit].mlen = 1; /* literal */
                 opt[last_match_pos+addLit].off = 0;
                 opt[last_match_pos+addLit].litlen = addLit;
                 opt[last_match_pos+addLit].price = opt[last_match_pos].price + LZ4HC_literalsPrice(addLit);
                 DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i) -- initial setup",
                             last_match_pos+addLit, opt[last_match_pos+addLit].price, addLit);
         }   }

         /* check further positions */
         for (cur = 1; cur < last_match_pos; cur++) {
             const BYTE* const curPtr = ip + cur;
             LZ4HC_match_t newMatch;

             if (curPtr > mflimit) break;
             DEBUGLOG(7, "rPos:%u[%u] vs [%u]%u",
                     cur, opt[cur].price, opt[cur+1].price, cur+1);
             if (fullUpdate) {
                 /* not useful to search here if next position has same (or lower) cost */
                 if ( (opt[cur+1].price <= opt[cur].price)
                   /* in some cases, next position has same cost, but cost rises sharply after, so a small match would still be beneficial */
                   && (opt[cur+MINMATCH].price < opt[cur].price + 3/*min seq price*/) )
                     continue;
             } else {
                 /* not useful to search here if next position has same (or lower) cost */
                 if (opt[cur+1].price <= opt[cur].price) continue;
             }

             DEBUGLOG(7, "search at rPos:%u", cur);
             if (fullUpdate)
                 newMatch = LZ4HC_FindLongerMatch(ctx, curPtr, matchlimit, MINMATCH-1, nbSearches, dict, favorDecSpeed);
             else
                 /* only test matches of minimum length; slightly faster, but misses a few bytes */
                 newMatch = LZ4HC_FindLongerMatch(ctx, curPtr, matchlimit, last_match_pos - cur, nbSearches, dict, favorDecSpeed);
             if (!newMatch.len) continue;

             if ( ((size_t)newMatch.len > sufficient_len)
               || (newMatch.len + cur >= LZ4_OPT_NUM) ) {
                 /* immediate encoding */
                 best_mlen = newMatch.len;
                 best_off = newMatch.off;
                 last_match_pos = cur + 1;
                 goto encode;
             }

             /* before match : set price with literals at beginning */
             {   int const baseLitlen = opt[cur].litlen;
                 int litlen;
                 for (litlen = 1; litlen < MINMATCH; litlen++) {
                     int const price = opt[cur].price - LZ4HC_literalsPrice(baseLitlen) + LZ4HC_literalsPrice(baseLitlen+litlen);
                     int const pos = cur + litlen;
                     if (price < opt[pos].price) {
                         opt[pos].mlen = 1; /* literal */
                         opt[pos].off = 0;
                         opt[pos].litlen = baseLitlen+litlen;
                         opt[pos].price = price;
                         DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i)",
                                     pos, price, opt[pos].litlen);
             }   }   }

             /* set prices using match at position = cur */
             {   int const matchML = newMatch.len;
                 int ml = MINMATCH;

                 assert(cur + newMatch.len < LZ4_OPT_NUM);
                 for ( ; ml <= matchML ; ml++) {
                     int const pos = cur + ml;
                     int const offset = newMatch.off;
                     int price;
                     int ll;
                     DEBUGLOG(7, "testing price rPos %i (last_match_pos=%i)",
                                 pos, last_match_pos);
                     if (opt[cur].mlen == 1) {
                         ll = opt[cur].litlen;
                         price = ((cur > ll) ? opt[cur - ll].price : 0)
                               + LZ4HC_sequencePrice(ll, ml);
                     } else {
                         ll = 0;
                         price = opt[cur].price + LZ4HC_sequencePrice(0, ml);
                     }

                    assert((U32)favorDecSpeed <= 1);
                     if (pos > last_match_pos+TRAILING_LITERALS
                      || price <= opt[pos].price - (int)favorDecSpeed) {
                         DEBUGLOG(7, "rPos:%3i => price:%3i (matchlen=%i)",
                                     pos, price, ml);
                         assert(pos < LZ4_OPT_NUM);
                         if ( (ml == matchML)  /* last pos of last match */
                           && (last_match_pos < pos) )
                             last_match_pos = pos;
                         opt[pos].mlen = ml;
                         opt[pos].off = offset;
                         opt[pos].litlen = ll;
                         opt[pos].price = price;
             }   }   }
             /* complete following positions with literals */
             {   int addLit;
                 for (addLit = 1; addLit <= TRAILING_LITERALS; addLit ++) {
                     opt[last_match_pos+addLit].mlen = 1; /* literal */
                     opt[last_match_pos+addLit].off = 0;
                     opt[last_match_pos+addLit].litlen = addLit;
                     opt[last_match_pos+addLit].price = opt[last_match_pos].price + LZ4HC_literalsPrice(addLit);
                     DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i)", last_match_pos+addLit, opt[last_match_pos+addLit].price, addLit);
             }   }
         }  /* for (cur = 1; cur <= last_match_pos; cur++) */

         assert(last_match_pos < LZ4_OPT_NUM + TRAILING_LITERALS);
         best_mlen = opt[last_match_pos].mlen;
         best_off = opt[last_match_pos].off;
         cur = last_match_pos - best_mlen;

encode: /* cur, last_match_pos, best_mlen, best_off must be set */
         assert(cur < LZ4_OPT_NUM);
         assert(last_match_pos >= 1);  /* == 1 when only one candidate */
         DEBUGLOG(6, "reverse traversal, looking for shortest path (last_match_pos=%i)", last_match_pos);
         {   int candidate_pos = cur;
             int selected_matchLength = best_mlen;
             int selected_offset = best_off;
             while (1) {  /* from end to beginning */
                 int const next_matchLength = opt[candidate_pos].mlen;  /* can be 1, means literal */
                 int const next_offset = opt[candidate_pos].off;
                 DEBUGLOG(7, "pos %i: sequence length %i", candidate_pos, selected_matchLength);
                 opt[candidate_pos].mlen = selected_matchLength;
                 opt[candidate_pos].off = selected_offset;
                 selected_matchLength = next_matchLength;
                 selected_offset = next_offset;
                 if (next_matchLength > candidate_pos) break; /* last match elected, first match to encode */
                 assert(next_matchLength > 0);  /* can be 1, means literal */
                 candidate_pos -= next_matchLength;
         }   }

         /* encode all recorded sequences in order */
         {   int rPos = 0;  /* relative position (to ip) */
             while (rPos < last_match_pos) {
                 int const ml = opt[rPos].mlen;
                 int const offset = opt[rPos].off;
                 if (ml == 1) { ip++; rPos++; continue; }  /* literal; note: can end up with several literals, in which case, skip them */
                 rPos += ml;
                 assert(ml >= MINMATCH);
                 assert((offset >= 1) && (offset <= LZ4_DISTANCE_MAX));
                 opSaved = op;
                 if ( LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), ml, ip - offset, limit, oend) ) {  /* updates ip, op and anchor */
                     ovml = ml;
                     ovref = ip - offset;
                     goto _dest_overflow;
         }   }   }
     }  /* while (ip <= mflimit) */

_last_literals:
     /* Encode Last Literals */
     {   size_t lastRunSize = (size_t)(iend - anchor);  /* literals */
         size_t llAdd = (lastRunSize + 255 - RUN_MASK) / 255;
         size_t const totalSize = 1 + llAdd + lastRunSize;
         if (limit == fillOutput) oend += LASTLITERALS;  /* restore correct value */
         if (limit && (op + totalSize > oend)) {
             if (limit == limitedOutput) { /* Check output limit */
                retval = 0;
                goto _return_label;
             }
             /* adapt lastRunSize to fill 'dst' */
             lastRunSize  = (size_t)(oend - op) - 1 /*token*/;
             llAdd = (lastRunSize + 256 - RUN_MASK) / 256;
             lastRunSize -= llAdd;
         }
         DEBUGLOG(6, "Final literal run : %i literals", (int)lastRunSize);
         ip = anchor + lastRunSize; /* can be != iend if limit==fillOutput */

         if (lastRunSize >= RUN_MASK) {
             size_t accumulator = lastRunSize - RUN_MASK;
             *op++ = (RUN_MASK << ML_BITS);
             for(; accumulator >= 255 ; accumulator -= 255) *op++ = 255;
             *op++ = (BYTE) accumulator;
         } else {
             *op++ = (BYTE)(lastRunSize << ML_BITS);
         }
         memcpy(op, anchor, lastRunSize);
         op += lastRunSize;
     }

     /* End */
     *srcSizePtr = (int) (((const char*)ip) - source);
     retval = (int) ((char*)op-dst);
     goto _return_label;

_dest_overflow:
if (limit == fillOutput) {
     /* Assumption : ip, anchor, ovml and ovref must be set correctly */
     size_t const ll = (size_t)(ip - anchor);
     size_t const ll_addbytes = (ll + 240) / 255;
     size_t const ll_totalCost = 1 + ll_addbytes + ll;
     BYTE* const maxLitPos = oend - 3; /* 2 for offset, 1 for token */
     DEBUGLOG(6, "Last sequence overflowing (only %i bytes remaining)", (int)(oend-1-opSaved));
     op = opSaved;  /* restore correct out pointer */
     if (op + ll_totalCost <= maxLitPos) {
         /* ll validated; now adjust match length */
         size_t const bytesLeftForMl = (size_t)(maxLitPos - (op+ll_totalCost));
         size_t const maxMlSize = MINMATCH + (ML_MASK-1) + (bytesLeftForMl * 255);
         assert(maxMlSize < INT_MAX); assert(ovml >= 0);
         if ((size_t)ovml > maxMlSize) ovml = (int)maxMlSize;
         if ((oend + LASTLITERALS) - (op + ll_totalCost + 2) - 1 + ovml >= MFLIMIT) {
             DEBUGLOG(6, "Space to end : %i + ml (%i)", (int)((oend + LASTLITERALS) - (op + ll_totalCost + 2) - 1), ovml);
             DEBUGLOG(6, "Before : ip = %p, anchor = %p", ip, anchor);
             LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), ovml, ovref, notLimited, oend);
             DEBUGLOG(6, "After : ip = %p, anchor = %p", ip, anchor);
     }   }
     goto _last_literals;
}
_return_label:
#ifdef LZ4HC_HEAPMODE
     FREEMEM(opt);
#endif
     return retval;
}